

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_metric_space_gradation(REF_DBL *metric,REF_GRID ref_grid,REF_DBL r)

{
  REF_DBL *pRVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  REF_NODE ref_node;
  REF_NODE pRVar8;
  REF_DBL *pRVar9;
  size_t __size;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint uVar14;
  REF_STATUS RVar15;
  void *__ptr;
  long *plVar16;
  long lVar17;
  ulong uVar18;
  undefined8 uVar19;
  long lVar20;
  int node;
  ulong uVar21;
  long lVar22;
  char *pcVar23;
  REF_EDGE ref_edge_00;
  double dVar24;
  REF_EDGE ref_edge;
  REF_DBL limit_metric [6];
  REF_DBL limited [6];
  double local_108;
  double local_e8;
  REF_EDGE local_c8;
  REF_GRID local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  long local_a0;
  REF_DBL local_98;
  double adStack_90 [5];
  REF_DBL local_68 [7];
  
  ref_node = ref_grid->node;
  dVar24 = log(r);
  uVar14 = ref_edge_create(&local_c8,ref_grid);
  if (uVar14 == 0) {
    pRVar8 = ref_grid->node;
    uVar14 = pRVar8->max;
    if ((int)uVar14 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x2e7,"ref_metric_metric_space_gradation","malloc metric_orig of REF_DBL negative");
      return 1;
    }
    __size = (ulong)uVar14 * 0x30;
    local_c0 = ref_grid;
    __ptr = malloc(__size);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x2e7,"ref_metric_metric_space_gradation","malloc metric_orig of REF_DBL NULL");
      return 2;
    }
    if ((ulong)uVar14 != 0) {
      plVar16 = pRVar8->global;
      uVar18 = 0;
      do {
        if (-1 < *plVar16) {
          uVar21 = uVar18 & 0x7fffffff0;
          uVar19 = *(undefined8 *)((long)metric + uVar21);
          uVar10 = ((undefined8 *)((long)metric + uVar21))[1];
          puVar2 = (undefined8 *)((long)metric + uVar21 + 0x10);
          uVar11 = *puVar2;
          uVar12 = puVar2[1];
          puVar2 = (undefined8 *)((long)metric + uVar21 + 0x20);
          uVar13 = puVar2[1];
          puVar3 = (undefined8 *)((long)__ptr + uVar21 + 0x20);
          *puVar3 = *puVar2;
          puVar3[1] = uVar13;
          puVar2 = (undefined8 *)((long)__ptr + uVar21 + 0x10);
          *puVar2 = uVar11;
          puVar2[1] = uVar12;
          *(undefined8 *)((long)__ptr + uVar21) = uVar19;
          ((undefined8 *)((long)__ptr + uVar21))[1] = uVar10;
        }
        uVar18 = uVar18 + 0x30;
        plVar16 = plVar16 + 1;
      } while (__size != uVar18);
    }
    ref_edge_00 = local_c8;
    if (0 < local_c8->n) {
      lVar17 = 0;
      do {
        iVar7 = local_c8->e2n[lVar17 * 2];
        lVar20 = (long)iVar7;
        node = local_c8->e2n[lVar17 * 2 + 1];
        lVar22 = (long)node;
        pRVar9 = ref_node->real;
        local_b8 = pRVar9[lVar22 * 0xf] - pRVar9[lVar20 * 0xf];
        local_b0 = pRVar9[lVar22 * 0xf + 1] - pRVar9[lVar20 * 0xf + 1];
        local_a8 = pRVar9[lVar22 * 0xf + 2] - pRVar9[lVar20 * 0xf + 2];
        dVar4 = *(double *)((long)__ptr + lVar22 * 0x30 + 8);
        dVar5 = *(double *)((long)__ptr + lVar22 * 0x30 + 0x10);
        dVar6 = *(double *)((long)__ptr + lVar22 * 0x30 + 0x20);
        local_108 = (*(double *)((long)__ptr + lVar22 * 0x30 + 0x28) * local_a8 +
                    dVar5 * local_b8 + dVar6 * local_b0) * local_a8 +
                    (dVar5 * local_a8 +
                    *(double *)((long)__ptr + lVar22 * 0x30) * local_b8 + local_b0 * dVar4) *
                    local_b8 +
                    (dVar6 * local_a8 +
                    dVar4 * local_b8 + *(double *)((long)__ptr + lVar22 * 0x30 + 0x18) * local_b0) *
                    local_b0;
        local_a0 = lVar17;
        if (local_108 < 0.0) {
          local_108 = sqrt(local_108);
        }
        else {
          local_108 = SQRT(local_108);
        }
        pRVar9 = (REF_DBL *)((long)__ptr + lVar22 * 0x30);
        local_e8 = pow(local_108 * dVar24 + 1.0,-2.0);
        lVar17 = 0;
        do {
          pRVar1 = pRVar9 + lVar17;
          dVar4 = pRVar1[1];
          adStack_90[lVar17 + -1] = *pRVar1 * local_e8;
          adStack_90[lVar17] = dVar4 * local_e8;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 6);
        pRVar1 = (REF_DBL *)((long)__ptr + lVar20 * 0x30);
        RVar15 = ref_matrix_intersect(pRVar1,&local_98,local_68);
        if (RVar15 == 0) {
          RVar15 = ref_matrix_intersect(metric + lVar20 * 6,local_68,metric + lVar20 * 6);
          if (RVar15 != 0) {
            uVar19 = 0x307;
            pcVar23 = "update m0";
            goto LAB_0017c19c;
          }
          local_108 = (pRVar1[5] * local_a8 + pRVar1[2] * local_b8 + local_b0 * pRVar1[4]) *
                      local_a8 +
                      (pRVar1[2] * local_a8 + *pRVar1 * local_b8 + local_b0 * pRVar1[1]) * local_b8
                      + (pRVar1[4] * local_a8 + pRVar1[1] * local_b8 + pRVar1[3] * local_b0) *
                        local_b0;
          if (local_108 < 0.0) {
            local_108 = sqrt(local_108);
          }
          else {
            local_108 = SQRT(local_108);
          }
          local_e8 = pow(local_108 * dVar24 + 1.0,-2.0);
          lVar17 = 0;
          do {
            dVar4 = (pRVar1 + lVar17)[1];
            adStack_90[lVar17 + -1] = pRVar1[lVar17] * local_e8;
            adStack_90[lVar17] = dVar4 * local_e8;
            lVar17 = lVar17 + 2;
          } while (lVar17 != 6);
          RVar15 = ref_matrix_intersect(pRVar9,&local_98,local_68);
          if (RVar15 != 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x313,"ref_metric_metric_space_gradation","limit m1 with enlarged m0");
            goto LAB_0017c1ad;
          }
          RVar15 = ref_matrix_intersect(metric + lVar22 * 6,local_68,metric + lVar22 * 6);
          if (RVar15 != 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x31b,"ref_metric_metric_space_gradation","update m1");
            ref_node_location(ref_node,node);
            printf("ratio %24.15e enlarge %24.15e \n",local_108,local_e8);
            goto LAB_0017c1d1;
          }
        }
        else {
          uVar19 = 0x2ff;
          pcVar23 = "limit m0 with enlarged m1";
LAB_0017c19c:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar19,"ref_metric_metric_space_gradation",pcVar23);
          node = iVar7;
LAB_0017c1ad:
          ref_node_location(ref_node,node);
          printf("ratio %24.15e enlarge %24.15e \n",local_108,local_e8);
LAB_0017c1d1:
          puts("RECOVER ref_metric_metric_space_gradation");
        }
        lVar17 = local_a0 + 1;
        ref_edge_00 = local_c8;
      } while (lVar17 < local_c8->n);
    }
    free(__ptr);
    ref_edge_free(ref_edge_00);
    uVar14 = ref_node_ghost_dbl(local_c0->node,metric,6);
    if (uVar14 == 0) {
      return 0;
    }
    pcVar23 = "update ghosts";
    uVar19 = 0x327;
  }
  else {
    pcVar23 = "orig edges";
    uVar19 = 0x2e5;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar19,
         "ref_metric_metric_space_gradation",(ulong)uVar14,pcVar23);
  return uVar14;
}

Assistant:

REF_FCN REF_STATUS ref_metric_metric_space_gradation(REF_DBL *metric,
                                                     REF_GRID ref_grid,
                                                     REF_DBL r) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *metric_orig;
  REF_DBL ratio, enlarge, log_r;
  REF_DBL direction[3];
  REF_DBL limit_metric[6], limited[6];
  REF_INT node, i;
  REF_INT edge, node0, node1;

  log_r = log(r);

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc(metric_orig, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 6; i++) metric_orig[i + 6 * node] = metric[i + 6 * node];
  }

  /* F. Alauzet doi:10.1016/j.finel.2009.06.028 equation (9) */

  each_ref_edge(ref_edge, edge) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    direction[0] =
        (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
    direction[1] =
        (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
    direction[2] =
        (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node1]), direction);
    enlarge = pow(1.0 + ratio * log_r, -2.0);
    for (i = 0; i < 6; i++)
      limit_metric[i] = metric_orig[i + 6 * node1] * enlarge;
    if (REF_SUCCESS != ref_matrix_intersect(&(metric_orig[6 * node0]),
                                            limit_metric, limited)) {
      REF_WHERE("limit m0 with enlarged m1");
      ref_node_location(ref_node, node0);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
    if (REF_SUCCESS != ref_matrix_intersect(&(metric[6 * node0]), limited,
                                            &(metric[6 * node0]))) {
      REF_WHERE("update m0");
      ref_node_location(ref_node, node0);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node0]), direction);
    enlarge = pow(1.0 + ratio * log_r, -2.0);
    for (i = 0; i < 6; i++)
      limit_metric[i] = metric_orig[i + 6 * node0] * enlarge;
    if (REF_SUCCESS != ref_matrix_intersect(&(metric_orig[6 * node1]),
                                            limit_metric, limited)) {
      REF_WHERE("limit m1 with enlarged m0");
      ref_node_location(ref_node, node1);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
    if (REF_SUCCESS != ref_matrix_intersect(&(metric[6 * node1]), limited,
                                            &(metric[6 * node1]))) {
      REF_WHERE("update m1");
      ref_node_location(ref_node, node1);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
  }

  ref_free(metric_orig);

  ref_edge_free(ref_edge);

  RSS(ref_node_ghost_dbl(ref_grid_node(ref_grid), metric, 6), "update ghosts");

  return REF_SUCCESS;
}